

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O0

void __thiscall
ImageSpec::ImageSpec(ImageSpec *this,uint32_t w,uint32_t h,uint32_t d,FormatDescriptor *formatDesc)

{
  uint32_t in_ECX;
  undefined4 in_ESI;
  FormatDescriptor *in_RDI;
  undefined4 in_stack_ffffffffffffff38;
  FormatDescriptor *this_00;
  ImageSpec *this_01;
  undefined1 local_98 [152];
  
  this_00 = (FormatDescriptor *)(local_98 + 0x75);
  Origin::Origin((Origin *)this_00);
  this_01 = (ImageSpec *)local_98;
  FormatDescriptor::FormatDescriptor((FormatDescriptor *)this_01,this_00);
  ImageSpec(this_01,(uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,in_ECX,
            (Origin *)CONCAT44(in_ESI,in_stack_ffffffffffffff38),in_RDI);
  FormatDescriptor::~FormatDescriptor(in_RDI);
  return;
}

Assistant:

ImageSpec(uint32_t w, uint32_t h, uint32_t d, FormatDescriptor& formatDesc)
        : ImageSpec(w, h, d, Origin(), formatDesc) { }